

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayEnumerableItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  BOOL BVar1;
  Engine *this_00;
  Var local_30;
  Var value;
  uint32 i;
  uint32 length;
  ScriptContext *scriptContext;
  JavascriptArray *arr_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  scriptContext = (ScriptContext *)arr;
  arr_local = (JavascriptArray *)this;
  _i = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  value._4_4_ = ArrayObject::GetLength((ArrayObject *)scriptContext);
  for (value._0_4_ = 0; (uint)value < value._4_4_; value._0_4_ = (uint)value + 1) {
    local_30 = (void *)0x0;
    BVar1 = JavascriptArrayEnumerableItemAccessor::GetItem
                      ((JavascriptArray *)scriptContext,(uint)value,&local_30,_i);
    if (BVar1 == 0) {
      WriteTypeId(this,SCA_None);
    }
    else {
      this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_00,local_30);
    }
  }
  return;
}

Assistant:

void WriteArrayIndexProperties(JavascriptArray* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            uint32 length = arr->GetLength();

            for (uint32 i = 0; i < length; i++)
            {
                Var value = nullptr;
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    this->GetEngine()->Clone(value);
                }
                else
                {
                    WriteTypeId(SCA_None);
                }
            }
        }